

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void pulse_prog_banshee(CHAR_DATA *mob)

{
  CHAR_DATA *pCVar1;
  int iVar2;
  CHAR_DATA *in_RDI;
  char *spell;
  int dam;
  int sn;
  CHAR_DATA *victim;
  undefined1 in_stack_00001332;
  undefined1 in_stack_00001333;
  int in_stack_00001334;
  int in_stack_00001338;
  int in_stack_0000133c;
  CHAR_DATA *in_stack_00001340;
  CHAR_DATA *in_stack_00001348;
  int in_stack_00001368;
  int in_stack_00001370;
  char *in_stack_00001378;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  char *local_20;
  
  pCVar1 = in_RDI->fighting;
  local_20 = (char *)0x0;
  if ((pCVar1 != (CHAR_DATA *)0x0) && (iVar2 = number_percent(), iVar2 < 0x15)) {
    iVar2 = number_percent();
    if (iVar2 < 0x47) {
      iVar2 = number_percent();
      if (iVar2 < 0x29) {
        act(in_stack_ffffffffffffffd0,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
            (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
        local_20 = "deafen";
      }
      else {
        act(in_stack_ffffffffffffffd0,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
            (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
        act(in_stack_ffffffffffffffd0,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
            (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
        act(in_stack_ffffffffffffffd0,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
            (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
        local_20 = "weaken";
      }
    }
    else {
      act(in_stack_ffffffffffffffd0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      act(in_stack_ffffffffffffffd0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      dice(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      in_stack_ffffffffffffffc8 = 1;
      damage_new(in_stack_00001348,in_stack_00001340,in_stack_0000133c,in_stack_00001338,
                 in_stack_00001334,(bool)in_stack_00001333,(bool)in_stack_00001332,in_stack_00001368
                 ,in_stack_00001370,in_stack_00001378);
    }
    if ((local_20 != (char *)0x0) &&
       (iVar2 = skill_lookup((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)),
       -1 < iVar2)) {
      (*skill_table[iVar2].spell_fun)(iVar2,in_RDI->level + 1,in_RDI,pCVar1,0);
    }
  }
  return;
}

Assistant:

void pulse_prog_banshee(CHAR_DATA *mob)
{
	CHAR_DATA *victim = mob->fighting;
	int sn, dam;
	char *spell = nullptr;

	if (!victim || number_percent() > 20)
		return;

	if (number_percent() > 70)
	{
		act("$n lets out a terrible wail that forces you to cover your ears in pain!", mob, 0, victim, TO_VICT);
		act("$n lets out a terrible wail as $e draws near to $N.", mob, 0, victim, TO_NOTVICT);

		dam = dice(20, 7) + 20;

		damage_new(mob, victim, dam, TYPE_UNDEFINED, DAM_SOUND, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "piercing scream");
	}
	else if (number_percent() > 40)
	{
		act("$n screeches gleefully, mimicking a laugh.", mob, 0, victim, TO_ALL);
		act("$n's face contorts in terror.", victim, 0, mob, TO_ALL);
		act("$N's wailing causes your muscles to contort wildly in pain!", mob, 0, victim, TO_CHAR);

		spell = "weaken";
	}
	else
	{
		act("$n begins to howl mournfully, the unnatural notes piercing your mind.", mob, 0, victim, TO_ALL);
		spell = "deafen";
	}

	if (!spell || (sn = skill_lookup(spell)) < 0)
		return;

	(*skill_table[sn].spell_fun)(sn, mob->level + 1, mob, victim, TARGET_CHAR);
}